

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_SendToCommunicator
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  FSoundID *this;
  AInventory *pAVar1;
  char *pcVar2;
  bool bVar3;
  char *str;
  FString local_68;
  FString msg;
  char local_58 [8];
  char name [32];
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if ((arg1 == 0) || (!backSide)) {
    bVar3 = false;
    if ((it != (AActor *)0x0) && (bVar3 = false, it->player != (player_t *)0x0)) {
      FName::FName((FName *)(name + 0x1c),NAME_Communicator);
      pAVar1 = AActor::FindInventory(it,(FName *)(name + 0x1c));
      bVar3 = pAVar1 != (AInventory *)0x0;
    }
    if (bVar3) {
      mysnprintf(local_58,0x20,"svox/voc%d",(ulong)(uint)arg0);
      if (arg3 == 0) {
        player_t::SetLogNumber(it->player,arg0);
      }
      bVar3 = AActor::CheckLocalView(it,consoleplayer);
      if (bVar3) {
        S_StopSound(2);
        this = (FSoundID *)((long)&msg.Chars + 4);
        FSoundID::FSoundID(this,local_58);
        S_Sound(2,this,1.0,1.0);
        FString::FString(&local_68);
        FString::Format(&local_68,"TXT_COMM%d",(ulong)(uint)arg2);
        pcVar2 = FString::operator_cast_to_char_(&local_68);
        pcVar2 = FStringTable::operator[](&GStrings,pcVar2);
        if (pcVar2 != (char *)0x0) {
          Printf(3,"%s\n",pcVar2);
        }
        FString::~FString(&local_68);
      }
      ln_local._4_4_ = 1;
    }
    else {
      ln_local._4_4_ = 0;
    }
  }
  else {
    ln_local._4_4_ = 0;
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_SendToCommunicator)
// SendToCommunicator (voc #, front-only, identify, nolog)
{
	// This obviously isn't going to work for co-op.
	if (arg1 && backSide)
		return false;

	if (it != NULL && it->player != NULL && it->FindInventory(NAME_Communicator))
	{
		char name[32];									   
		mysnprintf (name, countof(name), "svox/voc%d", arg0);

		if (!arg3)
		{
			it->player->SetLogNumber (arg0);
		}

		if (it->CheckLocalView (consoleplayer))
		{
			S_StopSound (CHAN_VOICE);
			S_Sound (CHAN_VOICE, name, 1, ATTN_NORM);

			// Get the message from the LANGUAGE lump.
			FString msg;
			msg.Format("TXT_COMM%d", arg2);
			const char *str = GStrings[msg];
			if (str != NULL)
			{
				Printf (PRINT_CHAT, "%s\n", str);
			}
		}
		return true;
	}
	return false;
}